

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tree.cpp
# Opt level: O1

void initSearchTree(int *array,int length,Tree<int> *tree)

{
  int iVar1;
  undefined8 *puVar2;
  undefined4 extraout_var;
  int *piVar3;
  long *plVar4;
  byte bVar5;
  ulong uVar6;
  long *plVar7;
  
  if (length == 0) {
    (*tree->_vptr_Tree[9])(tree,0);
    return;
  }
  puVar2 = (undefined8 *)operator_new(0x30);
  *puVar2 = &PTR_getLeftPoint_00106d58;
  puVar2[1] = 0;
  *(undefined4 *)(puVar2 + 2) = 0;
  puVar2[3] = array;
  *(undefined4 *)(puVar2 + 4) = 0;
  puVar2[5] = 0;
  (*tree->_vptr_Tree[9])(tree,puVar2);
  if (1 < length) {
    bVar5 = 1;
    uVar6 = 1;
    plVar7 = (long *)0x0;
    do {
      iVar1 = (*tree->_vptr_Tree[8])();
      plVar4 = (long *)CONCAT44(extraout_var,iVar1);
LAB_0010243d:
      if (plVar4 != (long *)0x0) {
        iVar1 = array[uVar6];
        piVar3 = (int *)(**(code **)(*plVar4 + 0x20))(plVar4);
        plVar7 = plVar4;
        if (*piVar3 < iVar1) goto code_r0x00102456;
        puVar2 = (undefined8 *)*plVar4;
        bVar5 = 1;
        goto LAB_0010247e;
      }
      puVar2 = (undefined8 *)operator_new(0x30);
      *puVar2 = &PTR_getLeftPoint_00106d58;
      puVar2[1] = 0;
      *(undefined4 *)(puVar2 + 2) = 0;
      puVar2[3] = array + uVar6;
      *(undefined4 *)(puVar2 + 4) = 0;
      puVar2[5] = 0;
      (**(code **)(*plVar7 + 8 + (ulong)(((byte)~bVar5 & 1) << 6)))(plVar7,puVar2);
      uVar6 = uVar6 + 1;
    } while (uVar6 != (uint)length);
  }
  return;
code_r0x00102456:
  iVar1 = array[uVar6];
  piVar3 = (int *)(**(code **)(*plVar4 + 0x20))(plVar4);
  if (*piVar3 < iVar1) {
    puVar2 = (undefined8 *)(*plVar4 + 0x40);
    bVar5 = 0;
LAB_0010247e:
    plVar4 = (long *)(*(code *)*puVar2)(plVar4);
  }
  goto LAB_0010243d;
}

Assistant:

void initSearchTree(int* array, int length, Tree<int>& tree){
    if (length == 0){
        tree.setRoot(nullptr);
        return;
    }
    Node<int>* node = new Node<int>(array[0]);
    Node<int>* parent = nullptr;
    bool isLeft = true;
    tree.setRoot(node);
    for (int i = 1; i < length; ++i) {
        node = tree.getRoot();
        while (node){
            parent = node;
            if (array[i] <= node->getDataNode()){
                node = node->getLeftPoint();
                isLeft = true;
            } else if (array[i] > node->getDataNode()){
                    node = node->getRightPoint();
                    isLeft = false;
            }
        }
        node = new Node<int>(array[i]);
        if (isLeft){
            parent->setLeftPoint(node);
        } else {
            parent->setRightPoint(node);
        }
    }
}